

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

bool __thiscall OpenMD::PairList::hasPair(PairList *this,int i,int j)

{
  bool bVar1;
  pair<int,_int> this_00;
  int in_EDX;
  int in_ESI;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_RDI;
  iterator iter;
  _Self in_stack_ffffffffffffffd0;
  _Self local_20;
  int local_18;
  int local_14 [4];
  bool local_1;
  
  if (in_ESI == in_EDX) {
    local_1 = false;
  }
  else {
    if (in_EDX < in_ESI) {
      std::swap<int>(local_14,&local_18);
    }
    this_00 = std::make_pair<int&,int&>((int *)in_RDI,(int *)0x23ef65);
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 *)this_00,in_stack_ffffffffffffffd0._M_node);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::end(in_RDI);
    bVar1 = std::operator==(&local_20,(_Self *)&stack0xffffffffffffffd0);
    local_1 = (bool)(bVar1 - 1U & 1);
  }
  return local_1;
}

Assistant:

bool PairList::hasPair(int i, int j) {
    if (i == j) {
      return false;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));
    return iter == pairSet_.end() ? false : true;
  }